

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCanon.c
# Opt level: O0

int Map_CanonComputeFast
              (Map_Man_t *p,int nVarsMax,int nVarsReal,uint *uTruth,uchar *puPhases,uint *uTruthRes)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uTruth_00;
  uint uVar4;
  int local_60;
  int local_5c;
  int local_54;
  int Limit;
  int i;
  uint uPhaseBest;
  uint uCanonBest;
  uint uCanon1;
  uint uCanon0;
  uint uTruth1;
  uint uTruth0;
  uint *uTruthRes_local;
  uchar *puPhases_local;
  uint *uTruth_local;
  int nVarsReal_local;
  int nVarsMax_local;
  Map_Man_t *p_local;
  
  Limit = 0x10;
  if (nVarsMax == 6) {
    p_local._4_4_ = Map_CanonComputeSlow(p->uTruths,6,nVarsReal,uTruth,puPhases,uTruthRes);
  }
  else if (nVarsReal < 5) {
    uVar3 = *uTruth & 0xffff;
    if (p->pCounters[uVar3] < '\x01') {
      __assert_fail("p->pCounters[uTruth0] > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                    ,0xbc,
                    "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                   );
    }
    *uTruthRes = CONCAT22(p->uCanons[uVar3],p->uCanons[uVar3]);
    uTruthRes[1] = *uTruthRes;
    *puPhases = *p->uPhases[uVar3];
    p_local._4_4_ = 1;
  }
  else {
    if (nVarsMax != 5) {
      __assert_fail("nVarsMax == 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                    ,0xc3,
                    "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                   );
    }
    if (nVarsReal != 5) {
      __assert_fail("nVarsReal == 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                    ,0xc4,
                    "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                   );
    }
    uVar3 = *uTruth & 0xffff;
    uTruth_00 = *uTruth >> 0x10;
    if (uTruth_00 == 0) {
      *uTruthRes = (uint)p->uCanons[uVar3];
      uTruthRes[1] = *uTruthRes;
      if (p->pCounters[uVar3] < '\x05') {
        local_5c = (int)p->pCounters[uVar3];
      }
      else {
        local_5c = 4;
      }
      for (local_54 = 0; local_54 < local_5c; local_54 = local_54 + 1) {
        puPhases[local_54] = p->uPhases[uVar3][local_54];
      }
      p_local._4_4_ = local_5c;
    }
    else if (uVar3 == 0) {
      *uTruthRes = (uint)p->uCanons[uTruth_00];
      uTruthRes[1] = *uTruthRes;
      if (p->pCounters[uTruth_00] < '\x05') {
        local_60 = (int)p->pCounters[uTruth_00];
      }
      else {
        local_60 = 4;
      }
      for (local_54 = 0; local_54 < local_60; local_54 = local_54 + 1) {
        puPhases[local_54] = p->uPhases[uTruth_00][local_54];
        puPhases[local_54] = puPhases[local_54] | 0x10;
      }
      p_local._4_4_ = local_60;
    }
    else {
      uVar1 = p->uCanons[uVar3];
      uVar2 = p->uCanons[uTruth_00];
      if (uVar1 < uVar2) {
        if (uVar2 <= uVar1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                        ,0x106,
                        "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                       );
        }
        if (p->pCounters[uVar3] < '\x01') {
          __assert_fail("p->pCounters[uTruth0] > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                        ,0xf3,
                        "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                       );
        }
        i = -1;
        for (local_54 = 0; local_54 < p->pCounters[uVar3]; local_54 = local_54 + 1) {
          uVar4 = Extra_TruthPolarize(uTruth_00,(int)p->uPhases[uVar3][local_54],4);
          if ((uVar4 < (uint)i) &&
             (Limit = (int)p->uPhases[uVar3][local_54], i = uVar4, 0xf < (uint)Limit)) {
            __assert_fail("uPhaseBest < 16",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                          ,0xfc,
                          "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                         );
          }
        }
        *uTruthRes = (uint)uVar1 << 0x10 | i;
        uTruthRes[1] = *uTruthRes;
        *puPhases = (byte)Limit | 0x10;
        p_local._4_4_ = 1;
      }
      else {
        if (p->pCounters[uTruth_00] < '\x01') {
          __assert_fail("p->pCounters[uTruth1] > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                        ,0xe0,
                        "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                       );
        }
        i = -1;
        for (local_54 = 0; local_54 < p->pCounters[uTruth_00]; local_54 = local_54 + 1) {
          uVar4 = Extra_TruthPolarize(uVar3,(int)p->uPhases[uTruth_00][local_54],4);
          if ((uVar4 < (uint)i) &&
             (Limit = (int)p->uPhases[uTruth_00][local_54], i = uVar4, 0xf < (uint)Limit)) {
            __assert_fail("uPhaseBest < 16",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                          ,0xe9,
                          "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                         );
          }
        }
        *uTruthRes = (uint)uVar2 << 0x10 | i;
        uTruthRes[1] = *uTruthRes;
        *puPhases = (uchar)Limit;
        p_local._4_4_ = 1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Map_CanonComputeFast( Map_Man_t * p, int nVarsMax, int nVarsReal, unsigned uTruth[], unsigned char * puPhases, unsigned uTruthRes[] )
{
    unsigned uTruth0, uTruth1;
    unsigned uCanon0, uCanon1, uCanonBest;
    unsigned uPhaseBest = 16; // Suppress "might be used uninitialized" (asserts require < 16)
    int i, Limit;

    if ( nVarsMax == 6 )
        return Map_CanonComputeSlow( p->uTruths, nVarsMax, nVarsReal, uTruth, puPhases, uTruthRes );

    if ( nVarsReal < 5 )
    {
//        return Map_CanonComputeSlow( p->uTruths, nVarsMax, nVarsReal, uTruth, puPhases, uTruthRes );

        uTruth0 = uTruth[0] & 0xFFFF;
        assert( p->pCounters[uTruth0] > 0 );
        uTruthRes[0] = (p->uCanons[uTruth0] << 16) | p->uCanons[uTruth0];
        uTruthRes[1] = uTruthRes[0];
        puPhases[0] = p->uPhases[uTruth0][0];
        return 1;
    }

    assert( nVarsMax == 5 );
    assert( nVarsReal == 5 );
    uTruth0 = uTruth[0] & 0xFFFF;
    uTruth1 = (uTruth[0] >> 16);
    if ( uTruth1 == 0 )
    {
        uTruthRes[0] = p->uCanons[uTruth0];
        uTruthRes[1] = uTruthRes[0];
        Limit = (p->pCounters[uTruth0] > 4)? 4 : p->pCounters[uTruth0];
        for ( i = 0; i < Limit; i++ )
            puPhases[i] = p->uPhases[uTruth0][i];
        return Limit;
    }
    else if ( uTruth0 == 0 )
    {
        uTruthRes[0] = p->uCanons[uTruth1];
        uTruthRes[1] = uTruthRes[0];
        Limit = (p->pCounters[uTruth1] > 4)? 4 : p->pCounters[uTruth1];
        for ( i = 0; i < Limit; i++ )
        {
            puPhases[i] = p->uPhases[uTruth1][i];
            puPhases[i] |= (1 << 4);
        }
        return Limit;
    }
    uCanon0 = p->uCanons[uTruth0];
    uCanon1 = p->uCanons[uTruth1];
    if ( uCanon0 >= uCanon1 ) // using nCanon1 as the main one
    {
        assert( p->pCounters[uTruth1] > 0 );
        uCanonBest = 0xFFFFFFFF;
        for ( i = 0; i < p->pCounters[uTruth1]; i++ )
        {
            uCanon0 = Extra_TruthPolarize( uTruth0, p->uPhases[uTruth1][i], 4 );
            if ( uCanonBest > uCanon0 )
            {
                uCanonBest = uCanon0;
                uPhaseBest = p->uPhases[uTruth1][i];
                assert( uPhaseBest < 16 );
            }
        }
        uTruthRes[0] = (uCanon1 << 16) | uCanonBest;
        uTruthRes[1] = uTruthRes[0];
        puPhases[0] = uPhaseBest;
        return 1;
    }
    else if ( uCanon0 < uCanon1 )
    {
        assert( p->pCounters[uTruth0] > 0 );
        uCanonBest = 0xFFFFFFFF;
        for ( i = 0; i < p->pCounters[uTruth0]; i++ )
        {
            uCanon1 = Extra_TruthPolarize( uTruth1, p->uPhases[uTruth0][i], 4 );
            if ( uCanonBest > uCanon1 )
            {
                uCanonBest = uCanon1;
                uPhaseBest = p->uPhases[uTruth0][i];
                assert( uPhaseBest < 16 );
            }
        }
        uTruthRes[0] = (uCanon0 << 16) | uCanonBest;
        uTruthRes[1] = uTruthRes[0];
        puPhases[0] = uPhaseBest | (1 << 4);
        return 1;
    }
    else
    {
        assert( 0 );
        return Map_CanonComputeSlow( p->uTruths, nVarsMax, nVarsReal, uTruth, puPhases, uTruthRes );
    }
}